

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCompoundCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
cbtCompoundCompoundLeafCallback::Process
          (cbtCompoundCompoundLeafCallback *this,cbtDbvtNode *leaf0,cbtDbvtNode *leaf1)

{
  cbtScalar cVar1;
  float fVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  float fVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  float fVar8;
  cbtScalar cVar9;
  float fVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  float fVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint indexA;
  cbtCollisionShape *pcVar19;
  cbtTransform *pcVar20;
  void *pvVar21;
  cbtCollisionShape *pcVar22;
  cbtCollisionShape *pcVar23;
  cbtManifoldResult *pcVar24;
  _func_int **pp_Var25;
  cbtCollisionObjectWrapper *pcVar26;
  cbtCollisionObjectWrapper *pcVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  byte bVar32;
  byte bVar33;
  ulong uVar34;
  bool bVar35;
  int iVar36;
  long lVar37;
  cbtSimplePair *pcVar38;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  CProfileSample __profile;
  cbtVector3 aabbMax0;
  cbtVector3 aabbMin0;
  cbtCollisionObjectWrapper compoundWrap1;
  cbtCollisionObjectWrapper compoundWrap0;
  cbtVector3 aabbMax1;
  cbtVector3 aabbMin1;
  cbtTransform newChildWorldTrans1;
  cbtTransform newChildWorldTrans0;
  CProfileSample local_14d;
  float local_14c;
  float local_148;
  float local_144;
  float local_13c;
  float local_138;
  float local_134;
  float local_12c;
  ulong local_128;
  cbtCollisionObjectWrapper local_120;
  cbtCollisionObjectWrapper local_f8;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c0;
  float local_bc;
  float local_b8;
  cbtTransform local_b0;
  cbtTransform local_70;
  long *plVar39;
  
  CProfileSample::CProfileSample(&local_14d,"cbtCompoundCompoundLeafCallback::Process");
  this->m_numOverlapPairs = this->m_numOverlapPairs + 1;
  indexA = (leaf0->field_2).dataAsInt;
  local_128 = (ulong)(leaf1->field_2).dataAsInt;
  pcVar19 = this->m_compound1ColObjWrap->m_shape;
  pcVar20 = this->m_compound0ColObjWrap->m_worldTransform;
  pvVar21 = this->m_compound0ColObjWrap->m_shape[1].m_userPointer;
  lVar40 = (long)(int)indexA * 0x58;
  pcVar22 = *(cbtCollisionShape **)((long)pvVar21 + lVar40 + 0x40);
  lVar37 = local_128 * 0x58;
  pcVar23 = *(cbtCollisionShape **)((long)pcVar19[1].m_userPointer + lVar37 + 0x40);
  cVar1 = (pcVar20->m_basis).m_el[0].m_floats[0];
  fVar2 = (pcVar20->m_basis).m_el[0].m_floats[1];
  cVar3 = (pcVar20->m_basis).m_el[0].m_floats[2];
  cVar4 = (pcVar20->m_basis).m_el[1].m_floats[0];
  fVar5 = (pcVar20->m_basis).m_el[1].m_floats[1];
  cVar6 = (pcVar20->m_basis).m_el[1].m_floats[2];
  cVar7 = (pcVar20->m_basis).m_el[2].m_floats[0];
  fVar8 = (pcVar20->m_basis).m_el[2].m_floats[1];
  cVar9 = (pcVar20->m_basis).m_el[2].m_floats[2];
  fVar10 = *(float *)((long)pvVar21 + lVar40 + 0x10);
  uVar11 = *(uint *)((long)pvVar21 + lVar40);
  uVar12 = *(uint *)((long)pvVar21 + lVar40 + 4);
  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar10)),ZEXT416(uVar11),ZEXT416((uint)cVar1));
  uVar13 = *(uint *)((long)pvVar21 + lVar40 + 0x20);
  auVar28 = vfmadd231ss_fma(auVar42,ZEXT416(uVar13),ZEXT416((uint)cVar3));
  fVar14 = *(float *)((long)pvVar21 + lVar40 + 0x14);
  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar14)),ZEXT416(uVar12),ZEXT416((uint)cVar1));
  uVar15 = *(uint *)((long)pvVar21 + lVar40 + 0x24);
  auVar41 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar15),ZEXT416((uint)cVar3));
  uVar16 = *(uint *)((long)pvVar21 + lVar40 + 8);
  uVar17 = *(uint *)((long)pvVar21 + lVar40 + 0x18);
  auVar42 = vmulss_avx512f(ZEXT416((uint)fVar2),ZEXT416(uVar17));
  auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar16),ZEXT416((uint)cVar1));
  uVar18 = *(uint *)((long)pvVar21 + lVar40 + 0x28);
  auVar43 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar18),ZEXT416((uint)cVar3));
  auVar42 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)fVar10));
  auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar11),ZEXT416((uint)cVar4));
  auVar44 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar13),ZEXT416((uint)cVar6));
  auVar42 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)fVar14));
  auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar12),ZEXT416((uint)cVar4));
  auVar45 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar15),ZEXT416((uint)cVar6));
  auVar42 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416(uVar17));
  auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar16),ZEXT416((uint)cVar4));
  auVar46 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar18),ZEXT416((uint)cVar6));
  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar8)),ZEXT416((uint)cVar7),ZEXT416(uVar11));
  auVar29 = vfmadd231ss_fma(auVar42,ZEXT416((uint)cVar9),ZEXT416(uVar13));
  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar8)),ZEXT416((uint)cVar7),ZEXT416(uVar12));
  auVar47 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)cVar9),ZEXT416(uVar15));
  auVar42 = vmulss_avx512f(ZEXT416((uint)fVar8),ZEXT416(uVar17));
  auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)cVar7),ZEXT416(uVar16));
  auVar48 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)cVar9),ZEXT416(uVar18));
  uVar11 = *(uint *)((long)pvVar21 + lVar40 + 0x30);
  fVar10 = *(float *)((long)pvVar21 + lVar40 + 0x34);
  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar10)),ZEXT416(uVar11),ZEXT416((uint)cVar1));
  uVar12 = *(uint *)((long)pvVar21 + lVar40 + 0x38);
  auVar42 = vfmadd231ss_fma(auVar42,ZEXT416(uVar12),ZEXT416((uint)cVar3));
  auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar10)),ZEXT416(uVar11),ZEXT416((uint)cVar4));
  auVar30 = vfmadd231ss_fma(auVar30,ZEXT416(uVar12),ZEXT416((uint)cVar6));
  auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar8)),ZEXT416(uVar11),ZEXT416((uint)cVar7));
  auVar31 = vfmadd231ss_fma(auVar31,ZEXT416(uVar12),ZEXT416((uint)cVar9));
  auVar42 = vinsertps_avx(ZEXT416((uint)(auVar42._0_4_ + (pcVar20->m_origin).m_floats[0])),
                          ZEXT416((uint)(auVar30._0_4_ + (pcVar20->m_origin).m_floats[1])),0x10);
  local_70.m_origin.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar42,ZEXT416((uint)(auVar31._0_4_ + (pcVar20->m_origin).m_floats[2])),0x28);
  local_70.m_basis.m_el[0].m_floats[0] = auVar28._0_4_;
  local_70.m_basis.m_el[0].m_floats[1] = auVar41._0_4_;
  local_70.m_basis.m_el[0].m_floats[2] = auVar43._0_4_;
  local_70.m_basis.m_el[0].m_floats[3] = 0.0;
  local_70.m_basis.m_el[1].m_floats[0] = auVar44._0_4_;
  local_70.m_basis.m_el[1].m_floats[1] = auVar45._0_4_;
  local_70.m_basis.m_el[1].m_floats[2] = auVar46._0_4_;
  local_70.m_basis.m_el[1].m_floats[3] = 0.0;
  local_70.m_basis.m_el[2].m_floats[0] = auVar29._0_4_;
  local_70.m_basis.m_el[2].m_floats[1] = auVar47._0_4_;
  local_70.m_basis.m_el[2].m_floats[2] = auVar48._0_4_;
  local_70.m_basis.m_el[2].m_floats[3] = 0.0;
  pcVar20 = this->m_compound1ColObjWrap->m_worldTransform;
  cVar1 = (pcVar20->m_basis).m_el[0].m_floats[0];
  fVar2 = (pcVar20->m_basis).m_el[0].m_floats[1];
  cVar3 = (pcVar20->m_basis).m_el[0].m_floats[2];
  cVar4 = (pcVar20->m_basis).m_el[1].m_floats[0];
  fVar5 = (pcVar20->m_basis).m_el[1].m_floats[1];
  cVar6 = (pcVar20->m_basis).m_el[1].m_floats[2];
  cVar7 = (pcVar20->m_basis).m_el[2].m_floats[0];
  fVar8 = (pcVar20->m_basis).m_el[2].m_floats[1];
  cVar9 = (pcVar20->m_basis).m_el[2].m_floats[2];
  pvVar21 = pcVar19[1].m_userPointer;
  fVar10 = *(float *)((long)pvVar21 + lVar37 + 0x10);
  uVar11 = *(uint *)((long)pvVar21 + lVar37);
  uVar12 = *(uint *)((long)pvVar21 + lVar37 + 4);
  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar10)),ZEXT416(uVar11),ZEXT416((uint)cVar1));
  uVar13 = *(uint *)((long)pvVar21 + lVar37 + 0x20);
  auVar28 = vfmadd231ss_fma(auVar42,ZEXT416(uVar13),ZEXT416((uint)cVar3));
  fVar14 = *(float *)((long)pvVar21 + lVar37 + 0x14);
  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar14)),ZEXT416(uVar12),ZEXT416((uint)cVar1));
  uVar15 = *(uint *)((long)pvVar21 + lVar37 + 0x24);
  auVar41 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar15),ZEXT416((uint)cVar3));
  uVar16 = *(uint *)((long)pvVar21 + lVar37 + 8);
  uVar17 = *(uint *)((long)pvVar21 + lVar37 + 0x18);
  auVar42 = vmulss_avx512f(ZEXT416((uint)fVar2),ZEXT416(uVar17));
  auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar16),ZEXT416((uint)cVar1));
  uVar18 = *(uint *)((long)pvVar21 + lVar37 + 0x28);
  auVar43 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar18),ZEXT416((uint)cVar3));
  auVar42 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)fVar10));
  auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar11),ZEXT416((uint)cVar4));
  auVar44 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar13),ZEXT416((uint)cVar6));
  auVar42 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)fVar14));
  auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar12),ZEXT416((uint)cVar4));
  auVar45 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar15),ZEXT416((uint)cVar6));
  auVar42 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416(uVar17));
  auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar16),ZEXT416((uint)cVar4));
  auVar46 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar18),ZEXT416((uint)cVar6));
  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar8)),ZEXT416((uint)cVar7),ZEXT416(uVar11));
  auVar29 = vfmadd231ss_fma(auVar42,ZEXT416((uint)cVar9),ZEXT416(uVar13));
  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar8)),ZEXT416((uint)cVar7),ZEXT416(uVar12));
  auVar47 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)cVar9),ZEXT416(uVar15));
  auVar42 = vmulss_avx512f(ZEXT416((uint)fVar8),ZEXT416(uVar17));
  auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)cVar7),ZEXT416(uVar16));
  auVar48 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)cVar9),ZEXT416(uVar18));
  uVar11 = *(uint *)((long)pvVar21 + lVar37 + 0x30);
  fVar10 = *(float *)((long)pvVar21 + lVar37 + 0x34);
  auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar10)),ZEXT416(uVar11),ZEXT416((uint)cVar1));
  uVar12 = *(uint *)((long)pvVar21 + lVar37 + 0x38);
  auVar42 = vfmadd231ss_fma(auVar42,ZEXT416(uVar12),ZEXT416((uint)cVar3));
  auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar10)),ZEXT416(uVar11),ZEXT416((uint)cVar4));
  auVar30 = vfmadd231ss_fma(auVar30,ZEXT416(uVar12),ZEXT416((uint)cVar6));
  auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar8)),ZEXT416(uVar11),ZEXT416((uint)cVar7));
  auVar31 = vfmadd231ss_fma(auVar31,ZEXT416(uVar12),ZEXT416((uint)cVar9));
  auVar42 = vinsertps_avx(ZEXT416((uint)(auVar42._0_4_ + (pcVar20->m_origin).m_floats[0])),
                          ZEXT416((uint)(auVar30._0_4_ + (pcVar20->m_origin).m_floats[1])),0x10);
  local_b0.m_origin.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar42,ZEXT416((uint)(auVar31._0_4_ + (pcVar20->m_origin).m_floats[2])),0x28);
  local_b0.m_basis.m_el[0].m_floats[0] = auVar28._0_4_;
  local_b0.m_basis.m_el[0].m_floats[1] = auVar41._0_4_;
  local_b0.m_basis.m_el[0].m_floats[2] = auVar43._0_4_;
  local_b0.m_basis.m_el[0].m_floats[3] = 0.0;
  local_b0.m_basis.m_el[1].m_floats[0] = auVar44._0_4_;
  local_b0.m_basis.m_el[1].m_floats[1] = auVar45._0_4_;
  local_b0.m_basis.m_el[1].m_floats[2] = auVar46._0_4_;
  local_b0.m_basis.m_el[1].m_floats[3] = 0.0;
  local_b0.m_basis.m_el[2].m_floats[0] = auVar29._0_4_;
  local_b0.m_basis.m_el[2].m_floats[1] = auVar47._0_4_;
  local_b0.m_basis.m_el[2].m_floats[2] = auVar48._0_4_;
  local_b0.m_basis.m_el[2].m_floats[3] = 0.0;
  (*pcVar22->_vptr_cbtCollisionShape[2])(pcVar22,&local_70,&local_13c,&local_14c);
  (*pcVar23->_vptr_cbtCollisionShape[2])(pcVar23,&local_b0,&local_c0,&local_d0);
  fVar2 = this->m_resultOut->m_closestPointDistanceThreshold;
  local_13c = local_13c - fVar2;
  local_138 = local_138 - fVar2;
  local_134 = local_134 - fVar2;
  local_14c = fVar2 + local_14c;
  local_148 = fVar2 + local_148;
  local_144 = fVar2 + local_144;
  if (gCompoundCompoundChildShapePairCallback != (cbtShapePairCallback)0x0) {
    bVar35 = (*gCompoundCompoundChildShapePairCallback)(pcVar22,pcVar23);
    if (!bVar35) goto LAB_008df4b5;
  }
  uVar34 = local_128;
  bVar33 = 1;
  if ((local_13c <= local_d0) && (bVar33 = 1, local_c0 <= local_14c)) {
    bVar33 = 0;
  }
  bVar32 = 1;
  if ((local_134 <= local_c8) && (local_b8 <= local_144)) {
    bVar32 = bVar33;
  }
  if ((local_138 <= local_cc) && (!(bool)(bVar32 | local_148 < local_bc))) {
    local_f8.m_parent = this->m_compound0ColObjWrap;
    local_f8.m_collisionObject = (local_f8.m_parent)->m_collisionObject;
    local_f8.m_partId = -1;
    local_120.m_parent = this->m_compound1ColObjWrap;
    local_120.m_collisionObject = (local_120.m_parent)->m_collisionObject;
    local_120.m_partId = -1;
    local_120.m_index = (int)local_128;
    local_120.m_shape = pcVar23;
    local_120.m_worldTransform = &local_b0;
    local_f8.m_shape = pcVar22;
    local_f8.m_worldTransform = &local_70;
    local_f8.m_index = indexA;
    pcVar38 = cbtHashedSimplePairCache::findPair
                        (this->m_childCollisionAlgorithmCache,indexA,local_120.m_index);
    local_12c = this->m_resultOut->m_closestPointDistanceThreshold;
    if (local_12c <= 0.0) {
      if (pcVar38 == (cbtSimplePair *)0x0) {
        iVar36 = (*this->m_dispatcher->_vptr_cbtDispatcher[2])
                           (this->m_dispatcher,&local_f8,&local_120,this->m_sharedManifold,1);
        plVar39 = (long *)CONCAT44(extraout_var_00,iVar36);
        iVar36 = (*this->m_childCollisionAlgorithmCache->_vptr_cbtHashedSimplePairCache[3])
                           (this->m_childCollisionAlgorithmCache,(ulong)indexA,uVar34 & 0xffffffff);
        *(long **)(CONCAT44(extraout_var_01,iVar36) + 8) = plVar39;
      }
      else {
        plVar39 = (long *)(pcVar38->field_2).m_userPointer;
      }
    }
    else {
      iVar36 = (*this->m_dispatcher->_vptr_cbtDispatcher[2])
                         (this->m_dispatcher,&local_f8,&local_120,0,2);
      plVar39 = (long *)CONCAT44(extraout_var,iVar36);
    }
    pcVar24 = this->m_resultOut;
    pp_Var25 = (pcVar24->super_Result)._vptr_Result;
    pcVar26 = pcVar24->m_body0Wrap;
    pcVar27 = pcVar24->m_body1Wrap;
    pcVar24->m_body0Wrap = &local_f8;
    pcVar24->m_body1Wrap = &local_120;
    (*pp_Var25[2])(pcVar24,0xffffffff,(ulong)indexA);
    (*(this->m_resultOut->super_Result)._vptr_Result[3])
              (this->m_resultOut,0xffffffff,uVar34 & 0xffffffff);
    (**(code **)(*plVar39 + 0x10))
              (plVar39,&local_f8,&local_120,this->m_dispatchInfo,this->m_resultOut);
    pcVar24 = this->m_resultOut;
    pcVar24->m_body0Wrap = pcVar26;
    pcVar24->m_body1Wrap = pcVar27;
    if (0.0 < local_12c) {
      (**(code **)*plVar39)(plVar39);
      (*this->m_dispatcher->_vptr_cbtDispatcher[0xf])(this->m_dispatcher,plVar39);
    }
  }
LAB_008df4b5:
  CProfileSample::~CProfileSample(&local_14d);
  return;
}

Assistant:

void Process(const cbtDbvtNode* leaf0, const cbtDbvtNode* leaf1)
	{
		BT_PROFILE("cbtCompoundCompoundLeafCallback::Process");
		m_numOverlapPairs++;

		int childIndex0 = leaf0->dataAsInt;
		int childIndex1 = leaf1->dataAsInt;

		cbtAssert(childIndex0 >= 0);
		cbtAssert(childIndex1 >= 0);

		const cbtCompoundShape* compoundShape0 = static_cast<const cbtCompoundShape*>(m_compound0ColObjWrap->getCollisionShape());
		cbtAssert(childIndex0 < compoundShape0->getNumChildShapes());

		const cbtCompoundShape* compoundShape1 = static_cast<const cbtCompoundShape*>(m_compound1ColObjWrap->getCollisionShape());
		cbtAssert(childIndex1 < compoundShape1->getNumChildShapes());

		const cbtCollisionShape* childShape0 = compoundShape0->getChildShape(childIndex0);
		const cbtCollisionShape* childShape1 = compoundShape1->getChildShape(childIndex1);

		//backup
		cbtTransform orgTrans0 = m_compound0ColObjWrap->getWorldTransform();
		const cbtTransform& childTrans0 = compoundShape0->getChildTransform(childIndex0);
		cbtTransform newChildWorldTrans0 = orgTrans0 * childTrans0;

		cbtTransform orgTrans1 = m_compound1ColObjWrap->getWorldTransform();
		const cbtTransform& childTrans1 = compoundShape1->getChildTransform(childIndex1);
		cbtTransform newChildWorldTrans1 = orgTrans1 * childTrans1;

		//perform an AABB check first
		cbtVector3 aabbMin0, aabbMax0, aabbMin1, aabbMax1;
		childShape0->getAabb(newChildWorldTrans0, aabbMin0, aabbMax0);
		childShape1->getAabb(newChildWorldTrans1, aabbMin1, aabbMax1);

		cbtVector3 thresholdVec(m_resultOut->m_closestPointDistanceThreshold, m_resultOut->m_closestPointDistanceThreshold, m_resultOut->m_closestPointDistanceThreshold);

		aabbMin0 -= thresholdVec;
		aabbMax0 += thresholdVec;

		if (gCompoundCompoundChildShapePairCallback)
		{
			if (!gCompoundCompoundChildShapePairCallback(childShape0, childShape1))
				return;
		}

		if (TestAabbAgainstAabb2(aabbMin0, aabbMax0, aabbMin1, aabbMax1))
		{
			cbtCollisionObjectWrapper compoundWrap0(this->m_compound0ColObjWrap, childShape0, m_compound0ColObjWrap->getCollisionObject(), newChildWorldTrans0, -1, childIndex0);
			cbtCollisionObjectWrapper compoundWrap1(this->m_compound1ColObjWrap, childShape1, m_compound1ColObjWrap->getCollisionObject(), newChildWorldTrans1, -1, childIndex1);

			cbtSimplePair* pair = m_childCollisionAlgorithmCache->findPair(childIndex0, childIndex1);
			bool removePair = false;
			cbtCollisionAlgorithm* colAlgo = 0;
			if (m_resultOut->m_closestPointDistanceThreshold > 0)
			{
				colAlgo = m_dispatcher->findAlgorithm(&compoundWrap0, &compoundWrap1, 0, BT_CLOSEST_POINT_ALGORITHMS);
				removePair = true;
			}
			else
			{
				if (pair)
				{
					colAlgo = (cbtCollisionAlgorithm*)pair->m_userPointer;
				}
				else
				{
					colAlgo = m_dispatcher->findAlgorithm(&compoundWrap0, &compoundWrap1, m_sharedManifold, BT_CONTACT_POINT_ALGORITHMS);
					pair = m_childCollisionAlgorithmCache->addOverlappingPair(childIndex0, childIndex1);
					cbtAssert(pair);
					pair->m_userPointer = colAlgo;
				}
			}

			cbtAssert(colAlgo);

			const cbtCollisionObjectWrapper* tmpWrap0 = 0;
			const cbtCollisionObjectWrapper* tmpWrap1 = 0;

			tmpWrap0 = m_resultOut->getBody0Wrap();
			tmpWrap1 = m_resultOut->getBody1Wrap();

			m_resultOut->setBody0Wrap(&compoundWrap0);
			m_resultOut->setBody1Wrap(&compoundWrap1);

			m_resultOut->setShapeIdentifiersA(-1, childIndex0);
			m_resultOut->setShapeIdentifiersB(-1, childIndex1);

			colAlgo->processCollision(&compoundWrap0, &compoundWrap1, m_dispatchInfo, m_resultOut);

			m_resultOut->setBody0Wrap(tmpWrap0);
			m_resultOut->setBody1Wrap(tmpWrap1);

			if (removePair)
			{
				colAlgo->~cbtCollisionAlgorithm();
				m_dispatcher->freeCollisionAlgorithm(colAlgo);
			}
		}
	}